

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.h
# Opt level: O3

void __thiscall async_simple::Executor::schedule(Executor *this,Func *func,Duration dur)

{
  _Manager_type p_Var1;
  thread local_48;
  anon_class_48_3_7a1931e9_for__M_head_impl local_40;
  
  local_40.func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_40.func.super__Function_base._M_functor._8_8_ = 0;
  local_40.func.super__Function_base._M_manager = (_Manager_type)0x0;
  local_40.func._M_invoker = func->_M_invoker;
  p_Var1 = (func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_40.func.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(func->super__Function_base)._M_functor;
    local_40.func.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
    (func->super__Function_base)._M_manager = (_Manager_type)0x0;
    func->_M_invoker = (_Invoker_type)0x0;
    local_40.func.super__Function_base._M_manager = p_Var1;
  }
  local_40.this = this;
  local_40.dur.__r = dur.__r;
  std::thread::
  thread<async_simple::Executor::schedule(std::function<void()>,std::chrono::duration<long,std::ratio<1l,1000000l>>)::_lambda()_1_,,void>
            (&local_48,&local_40);
  std::thread::detach();
  if (local_48._M_id._M_thread == 0) {
    if (local_40.func.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_40.func.super__Function_base._M_manager)
                ((_Any_data *)&local_40.func,(_Any_data *)&local_40.func,__destroy_functor);
    }
    return;
  }
  std::terminate();
}

Assistant:

virtual void schedule(Func func, Duration dur) {
        std::thread([this, func = std::move(func), dur]() {
            std::this_thread::sleep_for(dur);
            schedule(std::move(func));
        }).detach();
    }